

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],long_long&,long_long&,long_long&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [19],longlong *params_1,longlong *params_2,longlong *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<const_char> *params_00;
  CappedArray<char,_26UL> *params_01;
  CappedArray<char,_26UL> *params_02;
  CappedArray<char,_26UL> *params_03;
  long lVar4;
  CappedArray<char,_26UL> *pCVar5;
  CappedArray<char,_26UL> *__return_storage_ptr__;
  String argValues [4];
  String *__return_storage_ptr___00;
  undefined8 uVar6;
  CappedArray<char,_26UL> local_c0;
  String local_98;
  String local_80;
  String local_68;
  String local_50;
  
  this->exception = (Exception *)0x0;
  local_c0.content._0_8_ = strlen(*params);
  pCVar5 = &local_c0;
  local_c0.currentSize = (size_t)params;
  __return_storage_ptr___00 = &local_98;
  concat<kj::ArrayPtr<char_const>>(__return_storage_ptr___00,(_ *)pCVar5,params_00);
  __return_storage_ptr__ = &local_c0;
  Stringifier::operator*(__return_storage_ptr__,(Stringifier *)pCVar5,*params_1);
  concat<kj::CappedArray<char,26ul>>(&local_80,(_ *)__return_storage_ptr__,params_01);
  pCVar5 = &local_c0;
  Stringifier::operator*(pCVar5,(Stringifier *)__return_storage_ptr__,*params_2);
  concat<kj::CappedArray<char,26ul>>(&local_68,(_ *)pCVar5,params_02);
  Stringifier::operator*(&local_c0,(Stringifier *)pCVar5,*params_3);
  concat<kj::CappedArray<char,26ul>>(&local_50,(_ *)&local_c0,params_03);
  uVar6 = 4;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)&local_98.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_98.content.size_ + lVar4);
      *(undefined8 *)((long)&local_98.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_98.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_98.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,__return_storage_ptr___00,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}